

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::dht_put_alert::dht_put_alert
          (dht_put_alert *this,stack_allocator *param_1,array<char,_32UL> *key,
          array<char,_64UL> *sig,string *s,int64_t sequence_number,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_put_alert_004c6528;
  digest32<160L>::clear(&this->target);
  uVar1 = *(undefined8 *)key->_M_elems;
  uVar2 = *(undefined8 *)(key->_M_elems + 8);
  uVar3 = *(undefined8 *)(key->_M_elems + 0x18);
  *(undefined8 *)((this->public_key)._M_elems + 0x10) = *(undefined8 *)(key->_M_elems + 0x10);
  *(undefined8 *)((this->public_key)._M_elems + 0x18) = uVar3;
  *(undefined8 *)(this->public_key)._M_elems = uVar1;
  *(undefined8 *)((this->public_key)._M_elems + 8) = uVar2;
  uVar1 = *(undefined8 *)(sig->_M_elems + 8);
  uVar2 = *(undefined8 *)(sig->_M_elems + 0x10);
  uVar3 = *(undefined8 *)(sig->_M_elems + 0x18);
  uVar4 = *(undefined8 *)(sig->_M_elems + 0x20);
  uVar5 = *(undefined8 *)(sig->_M_elems + 0x28);
  uVar6 = *(undefined8 *)(sig->_M_elems + 0x30);
  uVar7 = *(undefined8 *)(sig->_M_elems + 0x38);
  *(undefined8 *)(this->signature)._M_elems = *(undefined8 *)sig->_M_elems;
  *(undefined8 *)((this->signature)._M_elems + 8) = uVar1;
  *(undefined8 *)((this->signature)._M_elems + 0x10) = uVar2;
  *(undefined8 *)((this->signature)._M_elems + 0x18) = uVar3;
  *(undefined8 *)((this->signature)._M_elems + 0x20) = uVar4;
  *(undefined8 *)((this->signature)._M_elems + 0x28) = uVar5;
  *(undefined8 *)((this->signature)._M_elems + 0x30) = uVar6;
  *(undefined8 *)((this->signature)._M_elems + 0x38) = uVar7;
  ::std::__cxx11::string::string((string *)&this->salt,(string *)s);
  this->seq = sequence_number;
  this->num_success = n;
  return;
}

Assistant:

dht_put_alert::dht_put_alert(aux::stack_allocator&
		, std::array<char, 32> const& key
		, std::array<char, 64> const& sig
		, std::string s
		, std::int64_t sequence_number
		, int n)
		: target(nullptr)
		, public_key(key)
		, signature(sig)
		, salt(std::move(s))
		, seq(sequence_number)
		, num_success(n)
	{}